

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

uchar yy_find_reduce_action(uchar stateno,uchar iLookAhead)

{
  int iVar1;
  int i;
  uchar iLookAhead_local;
  uchar stateno_local;
  
  if (0x15 < stateno) {
    __assert_fail("stateno<=YY_REDUCE_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                  ,0x2f3,"unsigned char yy_find_reduce_action(unsigned char, unsigned char)");
  }
  if (iLookAhead != '\x1a') {
    iVar1 = (uint)iLookAhead + (int)yy_reduce_ofst[stateno];
    if ((-1 < iVar1) && (iVar1 < 0x7b)) {
      if ("\x18\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x10\x11\x12\x16"[iVar1] ==
          iLookAhead) {
        return "\x16\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x13\x12\x11CH\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x10\x0f\x15\x14\x13\x12\x11\x15\x14\x13\x12\x11G\x02\x03\x01\\DG\x17F[\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$MLGK%&"
               [iVar1];
      }
      __assert_fail("yy_lookahead[i]==iLookAhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2fe,"unsigned char yy_find_reduce_action(unsigned char, unsigned char)");
    }
    __assert_fail("i>=0 && i<YY_ACTTAB_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                  ,0x2fd,"unsigned char yy_find_reduce_action(unsigned char, unsigned char)");
  }
  __assert_fail("iLookAhead!=YYNOCODE",
                "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                ,0x2f6,"unsigned char yy_find_reduce_action(unsigned char, unsigned char)");
}

Assistant:

static YYACTIONTYPE yy_find_reduce_action(
  YYACTIONTYPE stateno,     /* Current state number */
  YYCODETYPE iLookAhead     /* The look-ahead token */
){
  int i;
#ifdef YYERRORSYMBOL
  if( stateno>YY_REDUCE_COUNT ){
    return yy_default[stateno];
  }
#else
  assert( stateno<=YY_REDUCE_COUNT );
#endif
  i = yy_reduce_ofst[stateno];
  assert( iLookAhead!=YYNOCODE );
  i += iLookAhead;
#ifdef YYERRORSYMBOL
  if( i<0 || i>=YY_ACTTAB_COUNT || yy_lookahead[i]!=iLookAhead ){
    return yy_default[stateno];
  }
#else
  assert( i>=0 && i<YY_ACTTAB_COUNT );
  assert( yy_lookahead[i]==iLookAhead );
#endif
  return yy_action[i];
}